

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfi.cpp
# Opt level: O0

TrackData * __thiscall
DFIDisk::load(TrackData *__return_storage_ptr__,DFIDisk *this,CylHead *cylhead,bool param_2)

{
  bool bVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte *pbVar3;
  value_type_conflict2 local_90;
  byte local_89;
  const_iterator cStack_88;
  uchar byte;
  const_iterator __end1;
  const_iterator __begin1;
  mapped_type *__range1;
  uint32_t total_time;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_times;
  FluxData flux_revs;
  mapped_type *data;
  bool param_2_local;
  CylHead *cylhead_local;
  DFIDisk *this_local;
  
  this_00 = &std::
             map<CylHead,_Data,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>
             ::operator[](&this->m_data,cylhead)->
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(this_00);
  if (bVar1) {
    TrackData::TrackData(__return_storage_ptr__,cylhead);
  }
  else {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    iVar2 = Data::size((Data *)this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,(long)iVar2);
    __range1._0_4_ = 0;
    __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
    cStack_88 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff78), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end1);
      local_89 = *pbVar3;
      if ((local_89 & 0x80) == 0) {
        __range1._0_4_ = (uint)local_89 + (int)__range1;
        if (local_89 != 0x7f) {
          local_90 = (int)__range1 * this->m_tick_ns;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,&local_90);
          __range1._0_4_ = 0;
        }
      }
      else {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)&flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_60);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
        iVar2 = Data::size((Data *)this_00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,(long)iVar2);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end1);
    }
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    if (!bVar1) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_60);
    }
    std::map<CylHead,_Data,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>::
    erase(&this->m_data,cylhead);
    TrackData::TrackData
              (__return_storage_ptr__,cylhead,
               (FluxData *)
               &flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,false);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)&flux_times.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        const auto& data = m_data[cylhead];
        if (data.empty())
            return TrackData(cylhead);

        FluxData flux_revs;
        std::vector<uint32_t> flux_times;
        flux_times.reserve(data.size());

        uint32_t total_time = 0;
        for (auto byte : data)
        {
            if (byte & 0x80)
            {
                flux_revs.push_back(std::move(flux_times));
                flux_times.clear();
                flux_times.reserve(data.size());
            }
            else
            {
                total_time += byte;

                if (byte != 0x7f)
                {
                    flux_times.push_back(total_time * m_tick_ns);
                    total_time = 0;
                }
            }
        }

        if (!flux_times.empty())
            flux_revs.push_back(std::move(flux_times));

        m_data.erase(cylhead);
        return TrackData(cylhead, std::move(flux_revs));
    }